

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_pthreads_threading.h
# Opt level: O0

bool __thiscall
lzham::tsstack<lzham::task_pool::task,_16U>::pop
          (tsstack<lzham::task_pool::task,_16U> *this,task *obj)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  undefined8 *in_RSI;
  long in_RDI;
  bool result;
  
  spinlock::lock((spinlock *)0x1248c2);
  bVar1 = 0 < *(int *)(in_RDI + 0x208);
  if (bVar1) {
    iVar2 = *(int *)(in_RDI + 0x208) + -1;
    *(int *)(in_RDI + 0x208) = iVar2;
    puVar3 = (undefined8 *)(in_RDI + 8 + (long)iVar2 * 0x20);
    *in_RSI = *puVar3;
    in_RSI[1] = puVar3[1];
    in_RSI[2] = puVar3[2];
    *(undefined4 *)(in_RSI + 3) = *(undefined4 *)(puVar3 + 3);
  }
  spinlock::unlock((spinlock *)0x124924);
  return bVar1;
}

Assistant:

inline bool pop(T& obj)
      {
         bool result = false;
         m_spinlock.lock();
         if (m_top > 0)
         {
            obj = m_stack[--m_top];
            result = true;
         }
         m_spinlock.unlock();
         return result;
      }